

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeGetUnusedPage(BtShared *pBt,Pgno pgno,MemPage **ppPage,int flags)

{
  int iVar1;
  int rc;
  int flags_local;
  MemPage **ppPage_local;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pBt_local._4_4_ = btreeGetPage(pBt,pgno,ppPage,flags);
  if (pBt_local._4_4_ == 0) {
    iVar1 = sqlite3PagerPageRefcount((*ppPage)->pDbPage);
    if (iVar1 < 2) {
      (*ppPage)->isInit = '\0';
    }
    else {
      releasePage(*ppPage);
      *ppPage = (MemPage *)0x0;
      pBt_local._4_4_ = sqlite3CorruptError(0xffa2);
    }
  }
  else {
    *ppPage = (MemPage *)0x0;
  }
  return pBt_local._4_4_;
}

Assistant:

static int btreeGetUnusedPage(
  BtShared *pBt,       /* The btree */
  Pgno pgno,           /* Number of the page to fetch */
  MemPage **ppPage,    /* Return the page in this parameter */
  int flags            /* PAGER_GET_NOCONTENT or PAGER_GET_READONLY */
){
  int rc = btreeGetPage(pBt, pgno, ppPage, flags);
  if( rc==SQLITE_OK ){
    if( sqlite3PagerPageRefcount((*ppPage)->pDbPage)>1 ){
      releasePage(*ppPage);
      *ppPage = 0;
      return SQLITE_CORRUPT_BKPT;
    }
    (*ppPage)->isInit = 0;
  }else{
    *ppPage = 0;
  }
  return rc;
}